

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

QMatchData * __thiscall
QSortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QSortedModelEngine *this,QString *part,
          QModelIndex *parent,int param_3)

{
  QString part_00;
  QString part_01;
  QString part_02;
  QString part_03;
  int *piVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  undefined8 uVar6;
  Data *pDVar7;
  bool bVar8;
  char cVar9;
  SortOrder SVar10;
  int iVar11;
  long *plVar12;
  QCompletionEngine *this_00;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  QCompletionEngine *pQVar20;
  QString *pQVar21;
  QArrayData *local_160;
  QArrayData *local_150;
  char16_t *local_148;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_140;
  QArrayData *local_138;
  char16_t *local_130;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_128;
  QArrayData *local_120;
  char16_t *local_118;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_110;
  QArrayData *local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  QArrayData *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_c8 [8];
  QArrayData *pQStack_c0;
  undefined8 local_b8;
  QArrayData *local_b0;
  char16_t *local_a8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a0;
  QMatchData local_98;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint uStack_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined1 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar12 = (long *)QAbstractProxyModel::sourceModel();
  local_98.indices.v = false;
  local_98.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr._0_4_ = 0;
  local_98.indices.vector.d.ptr._4_4_ = 0;
  local_98.indices.vector.d.size._0_4_ = 0;
  local_98.indices.vector.d.size._4_4_ = 0;
  local_98.indices.f = 0;
  local_98.indices.t = 0xffffffff;
  local_98.exactMatchIndex = -1;
  local_98.partial = false;
  local_98._45_3_ = 0xaaaaaa;
  bVar8 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&local_98);
  pDVar7 = local_98.indices.vector.d.d;
  if (bVar8) {
    (__return_storage_ptr__->indices).v = local_98.indices.v;
    piVar1 = (int *)CONCAT44(local_98.indices.vector.d.ptr._4_4_,local_98.indices.vector.d.ptr._0_4_
                            );
    local_98.indices.vector.d.d = (Data *)0x0;
    local_98.indices.vector.d.ptr._0_4_ = 0;
    local_98.indices.vector.d.ptr._4_4_ = 0;
    (__return_storage_ptr__->indices).vector.d.d = pDVar7;
    (__return_storage_ptr__->indices).vector.d.ptr = piVar1;
    qVar2 = CONCAT44(local_98.indices.vector.d.size._4_4_,(undefined4)local_98.indices.vector.d.size
                    );
    local_98.indices.vector.d.size._0_4_ = 0;
    local_98.indices.vector.d.size._4_4_ = 0;
    (__return_storage_ptr__->indices).vector.d.size = qVar2;
    (__return_storage_ptr__->indices).f = local_98.indices.f;
    (__return_storage_ptr__->indices).t = local_98.indices.t;
    __return_storage_ptr__->exactMatchIndex = local_98.exactMatchIndex;
    __return_storage_ptr__->partial = local_98.partial;
    goto LAB_00658da7;
  }
  SVar10 = sortOrder(this,parent);
  bVar8 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&local_98);
  if (bVar8) {
    if (local_98.indices.v == true) {
      bVar8 = CONCAT44(local_98.indices.vector.d.size._4_4_,
                       (undefined4)local_98.indices.vector.d.size) == 0;
    }
    else {
      bVar8 = local_98.indices.t < local_98.indices.f;
    }
    if (!bVar8) {
      if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_160 = &(local_98.indices.vector.d.d)->super_QArrayData;
      uVar17 = local_98.indices.f;
      uVar19 = local_98.indices.t;
      goto LAB_00658728;
    }
    local_160 = (QArrayData *)0x0;
    (__return_storage_ptr__->indices).v = false;
    (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
    (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
    *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
    __return_storage_ptr__->partial = false;
  }
  else {
    local_b0 = &((part->d).d)->super_QArrayData;
    local_a8 = (part->d).ptr;
    local_a0.ptr = (QAbstractItemModel *)(part->d).size;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_b0->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    part_00.d.d._4_4_ = in_stack_fffffffffffffe5c;
    part_00.d.d._0_4_ = in_stack_fffffffffffffe58;
    part_00.d.ptr = (char16_t *)this;
    part_00.d.size = (qsizetype)part;
    indexHint((QIndexMapper *)&local_68,this,part_00,(QModelIndex *)&local_b0,(SortOrder)parent);
    uVar19 = uStack_44;
    uVar17 = uStack_48;
    local_160 = (QArrayData *)local_68._8_8_;
    local_68._8_8_ = (QArrayData *)0x0;
    local_68._16_4_ = 0;
    local_68._20_4_ = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,2,0x10);
      }
    }
LAB_00658728:
    uVar15 = uVar19 + 1;
    uVar13 = uVar17 - 1;
    local_c8 = (undefined1  [8])0xffffffffffffffff;
    pQStack_c0 = (QArrayData *)0x0;
    local_b8 = 0;
    local_e8 = (QArrayData *)0x0;
    uStack_e0 = 0;
    local_d8 = 0;
    uVar14 = uVar13;
    uVar16 = uVar15;
    pQVar20 = &this->super_QCompletionEngine;
    if (1 < (int)(uVar15 - uVar13)) {
      do {
        uVar18 = (int)(uVar14 + uVar16) / 2;
        (**(code **)(*plVar12 + 0x60))
                  (&local_68,plVar12,uVar18,((this->super_QCompletionEngine).c)->column,parent);
        local_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
        local_c8._4_4_ = local_68._4_4_;
        local_c8._0_4_ = local_68._0_4_;
        pQStack_c0 = (QArrayData *)local_68._8_8_;
        (**(code **)(*plVar12 + 0x90))
                  (&local_68,plVar12,local_c8,((this->super_QCompletionEngine).c)->role);
        ::QVariant::toString();
        uVar6 = uStack_e0;
        pQVar5 = local_e8;
        uVar4 = local_f8;
        pQVar3 = local_108;
        local_108 = local_e8;
        local_e8 = pQVar3;
        uStack_e0 = uStack_100;
        uStack_100 = uVar6;
        local_f8 = local_d8;
        local_d8 = uVar4;
        this = (QSortedModelEngine *)pQVar20;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar5,2,0x10);
            this = (QSortedModelEngine *)pQVar20;
          }
        }
        bVar8 = SVar10 == AscendingOrder;
        ::QVariant::~QVariant((QVariant *)&local_68);
        pQVar20 = &this->super_QCompletionEngine;
        iVar11 = QString::compare((QString *)&local_e8,(CaseSensitivity)part);
        if (iVar11 < 0 != bVar8) {
          uVar16 = uVar18;
          uVar18 = uVar14;
        }
        uVar14 = uVar18;
      } while (1 < (int)(uVar16 - uVar14));
    }
    bVar8 = uVar16 != uVar17;
    if (SVar10 == AscendingOrder) {
      bVar8 = uVar14 != uVar19;
    }
    if (bVar8) {
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 - 1;
      uVar17 = uVar16;
      if (SVar10 == AscendingOrder) {
        uVar17 = uVar14;
      }
      this_00 = pQVar20;
      (**(code **)(*plVar12 + 0x60))(&local_68,plVar12,uVar17,pQVar20->c->column,parent);
      local_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
      local_c8._4_4_ = local_68._4_4_;
      local_c8._0_4_ = local_68._0_4_;
      pQStack_c0 = (QArrayData *)local_68._8_8_;
      (**(code **)(*plVar12 + 0x90))(&local_68,plVar12,local_c8,pQVar20->c->role);
      ::QVariant::toString();
      uVar6 = uStack_e0;
      pQVar5 = local_e8;
      uVar4 = local_f8;
      pQVar3 = local_108;
      local_108 = local_e8;
      local_e8 = pQVar3;
      uStack_e0 = uStack_100;
      uStack_100 = uVar6;
      local_f8 = local_d8;
      local_d8 = uVar4;
      pQVar21 = part;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_68);
      cVar9 = QString::startsWith((QString *)&local_e8,(CaseSensitivity)part);
      if (cVar9 == '\0') {
        local_138 = &((part->d).d)->super_QArrayData;
        local_130 = (part->d).ptr;
        local_128.ptr = (QAbstractItemModel *)(part->d).size;
        if (local_138 != (QArrayData *)0x0) {
          LOCK();
          (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_138->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_68._0_4_ = local_68._0_4_ & 0xffffff00;
        local_68._8_8_ = (QArrayData *)0x0;
        local_68._16_4_ = 0;
        local_68._20_4_ = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        uStack_48 = 0;
        uStack_44 = 0xffffffff;
        uStack_40 = 0xffffffff;
        local_3c = 0;
        part_02.d.d._4_4_ = SVar10;
        part_02.d.d._0_4_ = in_stack_fffffffffffffe58;
        part_02.d.ptr = (char16_t *)this_00;
        part_02.d.size = (qsizetype)pQVar21;
        QCompletionEngine::saveInCache
                  (this_00,part_02,(QModelIndex *)&local_138,(QMatchData *)parent);
        if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_68._8_8_ = *(int *)local_68._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_68._8_8_ == 0) {
            QArrayData::deallocate((QArrayData *)local_68._8_8_,4,0x10);
          }
        }
        if (local_138 != (QArrayData *)0x0) {
          LOCK();
          (local_138->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_138->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          iVar11 = (local_138->ref_)._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar3 = local_138;
          goto joined_r0x00658c88;
        }
        goto LAB_00658d42;
      }
      iVar11 = QString::compare((QString *)&local_e8,(CaseSensitivity)part);
      uVar19 = uVar14;
      if (SVar10 != AscendingOrder) {
        uVar15 = uVar16;
        uVar19 = uVar13;
      }
      pQVar20 = this_00;
      if (1 < (int)(uVar15 - uVar19)) {
        do {
          uVar13 = (int)(uVar15 + uVar19) / 2;
          (**(code **)(*plVar12 + 0x60))(&local_68,plVar12,uVar13,this_00->c->column,parent);
          local_b8 = CONCAT44(local_68._20_4_,local_68._16_4_);
          local_c8._4_4_ = local_68._4_4_;
          local_c8._0_4_ = local_68._0_4_;
          pQStack_c0 = (QArrayData *)local_68._8_8_;
          (**(code **)(*plVar12 + 0x90))(&local_68,plVar12,local_c8,this_00->c->role);
          ::QVariant::toString();
          uVar6 = uStack_e0;
          pQVar5 = local_e8;
          uVar4 = local_f8;
          pQVar3 = local_108;
          local_108 = local_e8;
          local_e8 = pQVar3;
          uStack_e0 = uStack_100;
          uStack_100 = uVar6;
          local_f8 = local_d8;
          local_d8 = uVar4;
          this_00 = pQVar20;
          if (pQVar5 != (QArrayData *)0x0) {
            LOCK();
            (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
              this_00 = pQVar20;
            }
          }
          bVar8 = SVar10 == AscendingOrder;
          ::QVariant::~QVariant((QVariant *)&local_68);
          pQVar20 = this_00;
          cVar9 = QString::startsWith((QString *)&local_e8,(CaseSensitivity)pQVar21);
          if ((bool)cVar9 != bVar8) {
            uVar15 = uVar13;
            uVar13 = uVar19;
          }
          uVar19 = uVar13;
        } while (1 < (int)(uVar15 - uVar19));
      }
      *(undefined1 **)&__return_storage_ptr__->indices = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->indices).vector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      uVar19 = uVar19 + 1;
      if (SVar10 == AscendingOrder) {
        uVar19 = uVar14;
      }
      *(undefined1 **)&(__return_storage_ptr__->indices).f = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->exactMatchIndex = &DAT_aaaaaaaaaaaaaaaa;
      if (SVar10 == AscendingOrder) {
        uVar16 = uVar15 - 1;
      }
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      (__return_storage_ptr__->indices).vector.d.size = 0;
      (__return_storage_ptr__->indices).f = uVar19;
      (__return_storage_ptr__->indices).t = uVar16;
      __return_storage_ptr__->exactMatchIndex = -(uint)(iVar11 != 0) | uVar17;
      __return_storage_ptr__->partial = false;
      local_150 = &((pQVar21->d).d)->super_QArrayData;
      local_148 = (pQVar21->d).ptr;
      local_140.ptr = (QAbstractItemModel *)(pQVar21->d).size;
      if (local_150 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_150->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_150->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      part_03.d.d._4_4_ = SVar10;
      part_03.d.d._0_4_ = in_stack_fffffffffffffe58;
      part_03.d.ptr = (char16_t *)pQVar20;
      part_03.d.size = (qsizetype)pQVar21;
      QCompletionEngine::saveInCache(pQVar20,part_03,(QModelIndex *)&local_150,(QMatchData *)parent)
      ;
      if (local_150 != (QArrayData *)0x0) {
        LOCK();
        (local_150->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_150->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_150->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_150,2,0x10);
        }
      }
    }
    else {
      local_120 = &((part->d).d)->super_QArrayData;
      local_118 = (part->d).ptr;
      local_110.ptr = (QAbstractItemModel *)(part->d).size;
      if (local_120 != (QArrayData *)0x0) {
        LOCK();
        (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_120->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_68._0_4_ = local_68._0_4_ & 0xffffff00;
      local_68._8_8_ = (QArrayData *)0x0;
      local_68._16_4_ = 0;
      local_68._20_4_ = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      uStack_48 = 0;
      uStack_44 = 0xffffffff;
      uStack_40 = 0xffffffff;
      local_3c = 0;
      part_01.d.d._4_4_ = SVar10;
      part_01.d.d._0_4_ = in_stack_fffffffffffffe58;
      part_01.d.ptr = (char16_t *)pQVar20;
      part_01.d.size = (qsizetype)part;
      QCompletionEngine::saveInCache(pQVar20,part_01,(QModelIndex *)&local_120,(QMatchData *)parent)
      ;
      if ((QArrayData *)local_68._8_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_68._8_8_ = *(int *)local_68._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_68._8_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_68._8_8_,4,0x10);
        }
      }
      if (local_120 != (QArrayData *)0x0) {
        LOCK();
        (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        iVar11 = (local_120->ref_)._q_value.super___atomic_base<int>._M_i;
        UNLOCK();
        pQVar3 = local_120;
joined_r0x00658c88:
        if (iVar11 == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
LAB_00658d42:
      (__return_storage_ptr__->indices).v = false;
      (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
      (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
      *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
      __return_storage_ptr__->partial = false;
    }
    if (local_e8 != (QArrayData *)0x0) {
      LOCK();
      (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_e8,2,0x10);
      }
    }
  }
  if (local_160 != (QArrayData *)0x0) {
    LOCK();
    (local_160->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_160->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_160->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_160,4,0x10);
    }
  }
LAB_00658da7:
  if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_98.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QMatchData QSortedModelEngine::filter(const QString& part, const QModelIndex& parent, int)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    QMatchData hint;
    if (lookupCache(part, parent, &hint))
        return hint;

    QIndexMapper indices;
    Qt::SortOrder order = sortOrder(parent);

    if (matchHint(part, parent, &hint)) {
        if (!hint.isValid())
            return QMatchData();
        indices = hint.indices;
    } else {
        indices = indexHint(part, parent, order);
    }

    // binary search the model within 'indices' for 'part' under 'parent'
    int high = indices.to() + 1;
    int low = indices.from() - 1;
    int probe;
    QModelIndex probeIndex;
    QString probeData;

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const int cmp = QString::compare(probeData, part, c->cs);
        if ((order == Qt::AscendingOrder && cmp >= 0)
            || (order == Qt::DescendingOrder && cmp < 0)) {
            high = probe;
        } else {
            low = probe;
        }
    }

    if ((order == Qt::AscendingOrder && low == indices.to())
        || (order == Qt::DescendingOrder && high == indices.from())) { // not found
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    probeIndex = model->index(order == Qt::AscendingOrder ? low+1 : high-1, c->column, parent);
    probeData = model->data(probeIndex, c->role).toString();
    if (!probeData.startsWith(part, c->cs)) {
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    const bool exactMatch = QString::compare(probeData, part, c->cs) == 0;
    int emi =  exactMatch ? (order == Qt::AscendingOrder ? low+1 : high-1) : -1;

    int from = 0;
    int to = 0;
    if (order == Qt::AscendingOrder) {
        from = low + 1;
        high = indices.to() + 1;
        low = from;
    } else {
        to = high - 1;
        low = indices.from() - 1;
        high = to;
    }

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const bool startsWith = probeData.startsWith(part, c->cs);
        if ((order == Qt::AscendingOrder && startsWith)
            || (order == Qt::DescendingOrder && !startsWith)) {
            low = probe;
        } else {
            high = probe;
        }
    }

    QMatchData m(order == Qt::AscendingOrder ? QIndexMapper(from, high - 1) : QIndexMapper(low+1, to), emi, false);
    saveInCache(part, parent, m);
    return m;
}